

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  int *iStart;
  undefined8 *puVar4;
  BYTE *pBVar5;
  ulong *puVar6;
  BYTE *pBVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  ulong *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  bool bVar16;
  uint uVar17;
  undefined8 uVar18;
  uint uVar19;
  U32 UVar20;
  ulong *puVar21;
  size_t sVar22;
  ulong *puVar23;
  ulong *puVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  ulong uVar28;
  int *piVar29;
  ulong uVar30;
  ulong *puVar31;
  long *plVar32;
  BYTE *litEnd_1;
  int *piVar33;
  ulong *puVar34;
  BYTE *pBVar35;
  long lVar36;
  ulong *puVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar44;
  int iVar45;
  U32 UVar46;
  uint uVar47;
  U32 UVar48;
  int iVar49;
  U32 UVar50;
  ulong *puVar51;
  BYTE *litEnd;
  uint uVar52;
  uint uVar53;
  seqDef *psVar54;
  BYTE *iend;
  BYTE *prefixLowest;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *dictBase;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  U32 *hashLong;
  BYTE *ilimit;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w;
  BYTE *dictStart;
  U32 dictStartIndex;
  U32 *hashSmall;
  U32 *dictHashLong;
  U32 *dictHashSmall;
  U32 local_12c;
  ulong uVar43;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar45 = (int)pBVar9;
  iVar49 = (int)iEnd - iVar45;
  uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar8 = (ms->window).dictLimit;
  uVar17 = iVar49 - uVar19;
  if (iVar49 - uVar8 <= uVar19) {
    uVar17 = uVar8;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar8;
  }
  iStart = (int *)(pBVar9 + uVar17);
  pZVar10 = ms->dictMatchState;
  uVar8 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  piVar33 = (int *)(pBVar11 + uVar8);
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  uVar40 = ((int)pBVar11 - (int)mEnd) + uVar17;
  uVar43 = (ulong)uVar40;
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  puVar51 = (ulong *)((ulong)(((int)src - ((int)iStart + (int)piVar33)) + (int)mEnd == 0) +
                     (long)src);
  uVar19 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  pUVar13 = ms->chainTable;
  local_12c = *rep;
  UVar48 = rep[1];
  pUVar14 = pZVar10->hashTable;
  pUVar15 = pZVar10->chainTable;
  if (uVar19 == 5) {
    if (puVar51 < puVar6) {
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      bVar26 = 0x40 - (char)(ms->cParams).chainLog;
      bVar27 = 0x40 - (char)(pZVar10->cParams).hashLog;
      uVar19 = (pZVar10->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar21 = iEnd + -4;
LAB_001c1b4e:
      uVar30 = *puVar51;
      uVar39 = uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
      uVar44 = uVar30 * -0x30e4432345000000 >> (bVar26 & 0x3f);
      iVar49 = (int)puVar51;
      UVar50 = iVar49 - iVar45;
      uVar41 = pUVar12[uVar39];
      uVar28 = (ulong)uVar41;
      UVar46 = UVar50 + 1;
      uVar47 = UVar46 - local_12c;
      piVar29 = (int *)(pBVar9 + uVar47);
      if (uVar47 < uVar17) {
        piVar29 = (int *)(pBVar11 + (uVar47 - uVar40));
      }
      uVar52 = pUVar13[uVar44];
      pUVar13[uVar44] = UVar50;
      pUVar12[uVar39] = UVar50;
      if ((uVar47 - uVar17 < 0xfffffffd) && (*piVar29 == *(int *)((long)puVar51 + 1))) {
        puVar34 = (ulong *)((long)puVar51 + 1);
        puVar31 = iEnd;
        if (uVar47 < uVar17) {
          puVar31 = mEnd;
        }
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar51 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar31,(BYTE *)iStart);
        uVar30 = (long)puVar34 - (long)src;
        puVar51 = (ulong *)seqStore->lit;
        if (puVar21 < puVar34) {
          puVar31 = puVar51;
          puVar37 = (ulong *)src;
          if (src <= puVar21) {
            puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
            uVar28 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar28;
            puVar37 = puVar21;
            if (0x10 < (long)puVar21 - (long)src) {
              lVar36 = 0x10;
              do {
                uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                puVar4 = (undefined8 *)((long)puVar51 + lVar36);
                *puVar4 = *(undefined8 *)((long)src + lVar36);
                puVar4[1] = uVar18;
                pBVar35 = (BYTE *)((long)src + lVar36 + 0x10);
                uVar18 = *(undefined8 *)(pBVar35 + 8);
                puVar4[2] = *(undefined8 *)pBVar35;
                puVar4[3] = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (puVar4 + 4 < puVar31);
            }
          }
          if (puVar37 < puVar34) {
            lVar36 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar36) = *(BYTE *)((long)puVar37 + lVar36);
              lVar36 = lVar36 + 1;
            } while ((long)puVar34 - (long)puVar37 != lVar36);
          }
LAB_001c1faf:
          seqStore->lit = seqStore->lit + uVar30;
          psVar54 = seqStore->sequences;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar28 = *(ulong *)((long)src + 8);
          *puVar51 = *src;
          puVar51[1] = uVar28;
          pBVar35 = seqStore->lit;
          if (0x10 < uVar30) {
            uVar28 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar35 + 0x18) = uVar28;
            if (0x20 < (long)uVar30) {
              lVar36 = 0;
              do {
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x20);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                pBVar5 = pBVar35 + lVar36 + 0x20;
                *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 8) = uVar18;
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x30);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 0x18) = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (pBVar5 + 0x20 < pBVar35 + uVar30);
            }
            goto LAB_001c1faf;
          }
          seqStore->lit = pBVar35 + uVar30;
          psVar54 = seqStore->sequences;
        }
        lVar36 = sVar22 + 4;
        uVar28 = sVar22 + 1;
        psVar54->litLength = (U16)uVar30;
        psVar54->offset = 1;
        UVar46 = local_12c;
        goto joined_r0x001c2143;
      }
      puVar34 = puVar51;
      if (uVar41 <= uVar17) {
        uVar41 = pUVar14[uVar30 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)];
        if ((uVar41 <= uVar8) || (*(ulong *)(pBVar11 + uVar41) != uVar30)) goto LAB_001c1e13;
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)(puVar51 + 1),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar36 = sVar22 + 8;
        UVar46 = UVar50 - (uVar40 + uVar41);
        if (src < puVar51) {
          piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
          puVar51 = (ulong *)((long)puVar51 + -1);
          do {
            if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c23d8;
            lVar36 = lVar36 + 1;
            puVar34 = (ulong *)((long)puVar51 + -1);
          } while ((piVar33 < piVar29) &&
                  (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                  bVar16));
          goto LAB_001c23d3;
        }
        goto LAB_001c23de;
      }
      puVar31 = (ulong *)(pBVar9 + uVar28);
      if (*puVar31 == uVar30) {
        puVar24 = puVar51 + 1;
        puVar37 = puVar31 + 1;
        puVar23 = puVar24;
        if (puVar24 < puVar1) {
          if (*puVar37 == *puVar24) {
            lVar36 = 0;
            do {
              puVar37 = (ulong *)((long)puVar51 + lVar36 + 0x10);
              if (puVar1 <= puVar37) {
                puVar37 = (ulong *)(pBVar9 + lVar36 + uVar28 + 0x10);
                puVar23 = (ulong *)((long)puVar51 + lVar36 + 0x10);
                goto LAB_001c21cd;
              }
              lVar38 = lVar36 + uVar28 + 0x10;
              uVar30 = *puVar37;
              lVar36 = lVar36 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar30);
            uVar30 = uVar30 ^ *(ulong *)(pBVar9 + lVar38);
            uVar39 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar30 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
          }
          else {
            uVar39 = *puVar24 ^ *puVar37;
            uVar30 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c21cd:
          if ((puVar23 < puVar2) && ((int)*puVar37 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar23 < puVar3) && ((short)*puVar37 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar23 < iEnd) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar23));
          }
          uVar30 = (long)puVar23 - (long)puVar24;
        }
        lVar36 = uVar30 + 8;
        UVar46 = iVar49 - (int)puVar31;
        if (puVar51 <= src) goto LAB_001c23de;
        piVar29 = (int *)(pBVar9 + (uVar28 - 1));
        puVar51 = (ulong *)((long)puVar51 + -1);
        do {
          if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c23d8;
          lVar36 = lVar36 + 1;
          puVar34 = (ulong *)((long)puVar51 + -1);
        } while ((iStart < piVar29) &&
                (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                bVar16));
        goto LAB_001c23d3;
      }
LAB_001c1e13:
      if (uVar17 < uVar52) {
        piVar29 = (int *)(pBVar9 + uVar52);
        if (*piVar29 != (int)*puVar51) goto LAB_001c1f35;
LAB_001c1e73:
        lVar36 = *(long *)((long)puVar51 + 1);
        uVar28 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f);
        puVar34 = (ulong *)((long)puVar51 + 1);
        uVar41 = pUVar12[uVar28];
        uVar30 = (ulong)uVar41;
        pUVar12[uVar28] = UVar46;
        if (uVar41 <= uVar17) {
          uVar41 = pUVar14[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)];
          if ((uVar41 <= uVar8) || (*(long *)(pBVar11 + uVar41) != lVar36)) goto LAB_001c2094;
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar51 + 9),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                              (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
          lVar36 = sVar22 + 8;
          UVar46 = UVar46 - (uVar40 + uVar41);
          if (src < puVar34) {
            piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
            do {
              if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c23d8;
              lVar36 = lVar36 + 1;
              puVar34 = (ulong *)((long)puVar51 + -1);
            } while ((piVar33 < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51,
                    puVar51 = puVar34, bVar16));
            goto LAB_001c23d3;
          }
          goto LAB_001c23de;
        }
        plVar32 = (long *)(pBVar9 + uVar30);
        if (*plVar32 == lVar36) {
          puVar37 = (ulong *)((long)puVar51 + 9);
          puVar31 = (ulong *)(plVar32 + 1);
          puVar24 = puVar37;
          if (puVar37 < puVar1) {
            if (*puVar31 == *puVar37) {
              lVar36 = 0;
              do {
                puVar31 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar9 + lVar36 + uVar30 + 0x10);
                  puVar24 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                  goto LAB_001c234b;
                }
                lVar38 = lVar36 + uVar30 + 0x10;
                uVar28 = *puVar31;
                lVar36 = lVar36 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar28);
              uVar28 = uVar28 ^ *(ulong *)(pBVar9 + lVar38);
              uVar39 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar28 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
            }
            else {
              uVar39 = *puVar37 ^ *puVar31;
              uVar28 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = uVar28 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c234b:
            if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar24 < iEnd) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24));
            }
            uVar28 = (long)puVar24 - (long)puVar37;
          }
          lVar36 = uVar28 + 8;
          UVar46 = (int)puVar34 - (int)plVar32;
          if (puVar34 <= src) goto LAB_001c23de;
          piVar29 = (int *)(pBVar9 + (uVar30 - 1));
          do {
            if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c23d8;
            lVar36 = lVar36 + 1;
            puVar34 = (ulong *)((long)puVar51 + -1);
          } while ((iStart < piVar29) &&
                  (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                  bVar16));
LAB_001c23d3:
          puVar34 = (ulong *)((long)puVar34 + 1);
        }
        else {
LAB_001c2094:
          puVar31 = (ulong *)((long)puVar51 + 4);
          puVar34 = (ulong *)(piVar29 + 1);
          if (uVar52 < uVar17) {
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)puVar31,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                (BYTE *)iStart);
            lVar36 = sVar22 + 4;
            UVar46 = UVar50 - uVar52;
            puVar34 = puVar51;
            if ((piVar33 < piVar29) && (src < puVar51)) {
              puVar51 = (ulong *)((long)puVar51 + -1);
              do {
                piVar29 = (int *)((long)piVar29 + -1);
                if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c23d8;
                lVar36 = lVar36 + 1;
                puVar34 = (ulong *)((long)puVar51 + -1);
              } while ((piVar33 < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
              goto LAB_001c23d3;
            }
          }
          else {
            puVar37 = puVar31;
            if (puVar31 < puVar1) {
              if (*puVar34 == *puVar31) {
                lVar36 = 0;
                do {
                  puVar34 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                  if (puVar1 <= puVar34) {
                    puVar34 = (ulong *)((long)piVar29 + lVar36 + 0xc);
                    puVar37 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                    goto LAB_001c22a0;
                  }
                  uVar30 = *(ulong *)((long)piVar29 + lVar36 + 0xc);
                  uVar28 = *puVar34;
                  lVar36 = lVar36 + 8;
                } while (uVar30 == uVar28);
                uVar28 = uVar28 ^ uVar30;
                uVar30 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar36;
              }
              else {
                uVar28 = *puVar31 ^ *puVar34;
                uVar30 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = uVar30 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001c22a0:
              if ((puVar37 < puVar2) && ((int)*puVar34 == (int)*puVar37)) {
                puVar37 = (ulong *)((long)puVar37 + 4);
                puVar34 = (ulong *)((long)puVar34 + 4);
              }
              if ((puVar37 < puVar3) && ((short)*puVar34 == (short)*puVar37)) {
                puVar37 = (ulong *)((long)puVar37 + 2);
                puVar34 = (ulong *)((long)puVar34 + 2);
              }
              if (puVar37 < iEnd) {
                puVar37 = (ulong *)((long)puVar37 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar37));
              }
              uVar30 = (long)puVar37 - (long)puVar31;
            }
            lVar36 = uVar30 + 4;
            UVar46 = iVar49 - (int)piVar29;
            puVar34 = puVar51;
            if ((iStart < piVar29) && (src < puVar51)) {
              puVar51 = (ulong *)((long)puVar51 + -1);
              do {
                piVar29 = (int *)((long)piVar29 + -1);
                if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c23d8;
                lVar36 = lVar36 + 1;
                puVar34 = (ulong *)((long)puVar51 + -1);
              } while ((iStart < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
              goto LAB_001c23d3;
            }
          }
        }
        goto LAB_001c23de;
      }
      uVar52 = pUVar15[uVar30 * -0x30e4432345000000 >> (0x40U - (char)uVar19 & 0x3f)];
      if ((uVar8 < uVar52) && (*(int *)(pBVar11 + uVar52) == (int)*puVar51)) {
        piVar29 = (int *)(pBVar11 + uVar52);
        uVar52 = uVar52 + uVar40;
        goto LAB_001c1e73;
      }
LAB_001c1f35:
      puVar51 = (ulong *)((long)puVar51 + ((long)puVar51 - (long)src >> 8) + 1);
      goto LAB_001c26f4;
    }
  }
  else if (uVar19 == 6) {
    if (puVar51 < puVar6) {
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      bVar26 = 0x40 - (char)(ms->cParams).chainLog;
      bVar27 = 0x40 - (char)(pZVar10->cParams).hashLog;
      uVar19 = (pZVar10->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar21 = iEnd + -4;
LAB_001c0e89:
      uVar30 = *puVar51;
      uVar39 = uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
      uVar44 = uVar30 * -0x30e4432340650000 >> (bVar26 & 0x3f);
      iVar49 = (int)puVar51;
      UVar50 = iVar49 - iVar45;
      uVar41 = pUVar12[uVar39];
      uVar28 = (ulong)uVar41;
      UVar46 = UVar50 + 1;
      uVar47 = UVar46 - local_12c;
      piVar29 = (int *)(pBVar9 + uVar47);
      if (uVar47 < uVar17) {
        piVar29 = (int *)(pBVar11 + (uVar47 - uVar40));
      }
      uVar52 = pUVar13[uVar44];
      pUVar13[uVar44] = UVar50;
      pUVar12[uVar39] = UVar50;
      if ((uVar47 - uVar17 < 0xfffffffd) && (*piVar29 == *(int *)((long)puVar51 + 1))) {
        puVar34 = (ulong *)((long)puVar51 + 1);
        puVar31 = iEnd;
        if (uVar47 < uVar17) {
          puVar31 = mEnd;
        }
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar51 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar31,(BYTE *)iStart);
        uVar30 = (long)puVar34 - (long)src;
        puVar51 = (ulong *)seqStore->lit;
        if (puVar21 < puVar34) {
          puVar31 = puVar51;
          puVar37 = (ulong *)src;
          if (src <= puVar21) {
            puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
            uVar28 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar28;
            puVar37 = puVar21;
            if (0x10 < (long)puVar21 - (long)src) {
              lVar36 = 0x10;
              do {
                uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                puVar4 = (undefined8 *)((long)puVar51 + lVar36);
                *puVar4 = *(undefined8 *)((long)src + lVar36);
                puVar4[1] = uVar18;
                pBVar35 = (BYTE *)((long)src + lVar36 + 0x10);
                uVar18 = *(undefined8 *)(pBVar35 + 8);
                puVar4[2] = *(undefined8 *)pBVar35;
                puVar4[3] = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (puVar4 + 4 < puVar31);
            }
          }
          if (puVar37 < puVar34) {
            lVar36 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar36) = *(BYTE *)((long)puVar37 + lVar36);
              lVar36 = lVar36 + 1;
            } while ((long)puVar34 - (long)puVar37 != lVar36);
          }
LAB_001c1300:
          seqStore->lit = seqStore->lit + uVar30;
          psVar54 = seqStore->sequences;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar28 = *(ulong *)((long)src + 8);
          *puVar51 = *src;
          puVar51[1] = uVar28;
          pBVar35 = seqStore->lit;
          if (0x10 < uVar30) {
            uVar28 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar35 + 0x18) = uVar28;
            if (0x20 < (long)uVar30) {
              lVar36 = 0;
              do {
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x20);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                pBVar5 = pBVar35 + lVar36 + 0x20;
                *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 8) = uVar18;
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x30);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 0x18) = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (pBVar5 + 0x20 < pBVar35 + uVar30);
            }
            goto LAB_001c1300;
          }
          seqStore->lit = pBVar35 + uVar30;
          psVar54 = seqStore->sequences;
        }
        lVar36 = sVar22 + 4;
        uVar28 = sVar22 + 1;
        psVar54->litLength = (U16)uVar30;
        psVar54->offset = 1;
        UVar46 = local_12c;
        goto joined_r0x001c149a;
      }
      puVar34 = puVar51;
      if (uVar41 <= uVar17) {
        uVar41 = pUVar14[uVar30 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)];
        if ((uVar41 <= uVar8) || (*(ulong *)(pBVar11 + uVar41) != uVar30)) goto LAB_001c1162;
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)(puVar51 + 1),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar36 = sVar22 + 8;
        UVar46 = UVar50 - (uVar40 + uVar41);
        if (src < puVar51) {
          piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
          puVar51 = (ulong *)((long)puVar51 + -1);
          do {
            if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c1738;
            lVar36 = lVar36 + 1;
            puVar34 = (ulong *)((long)puVar51 + -1);
          } while ((piVar33 < piVar29) &&
                  (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                  bVar16));
          goto LAB_001c1733;
        }
        goto LAB_001c173e;
      }
      puVar31 = (ulong *)(pBVar9 + uVar28);
      if (*puVar31 == uVar30) {
        puVar24 = puVar51 + 1;
        puVar37 = puVar31 + 1;
        puVar23 = puVar24;
        if (puVar24 < puVar1) {
          if (*puVar37 == *puVar24) {
            lVar36 = 0;
            do {
              puVar37 = (ulong *)((long)puVar51 + lVar36 + 0x10);
              if (puVar1 <= puVar37) {
                puVar37 = (ulong *)(pBVar9 + lVar36 + uVar28 + 0x10);
                puVar23 = (ulong *)((long)puVar51 + lVar36 + 0x10);
                goto LAB_001c1524;
              }
              lVar38 = lVar36 + uVar28 + 0x10;
              uVar30 = *puVar37;
              lVar36 = lVar36 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar30);
            uVar30 = uVar30 ^ *(ulong *)(pBVar9 + lVar38);
            uVar39 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar30 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
          }
          else {
            uVar39 = *puVar24 ^ *puVar37;
            uVar30 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c1524:
          if ((puVar23 < puVar2) && ((int)*puVar37 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar23 < puVar3) && ((short)*puVar37 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar23 < iEnd) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar23));
          }
          uVar30 = (long)puVar23 - (long)puVar24;
        }
        lVar36 = uVar30 + 8;
        UVar46 = iVar49 - (int)puVar31;
        if (puVar51 <= src) goto LAB_001c173e;
        piVar29 = (int *)(pBVar9 + (uVar28 - 1));
        puVar51 = (ulong *)((long)puVar51 + -1);
        do {
          if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c1738;
          lVar36 = lVar36 + 1;
          puVar34 = (ulong *)((long)puVar51 + -1);
        } while ((iStart < piVar29) &&
                (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                bVar16));
        goto LAB_001c1733;
      }
LAB_001c1162:
      if (uVar17 < uVar52) {
        piVar29 = (int *)(pBVar9 + uVar52);
        if (*piVar29 != (int)*puVar51) goto LAB_001c1286;
LAB_001c11cc:
        lVar36 = *(long *)((long)puVar51 + 1);
        uVar28 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f);
        puVar34 = (ulong *)((long)puVar51 + 1);
        uVar41 = pUVar12[uVar28];
        uVar30 = (ulong)uVar41;
        pUVar12[uVar28] = UVar46;
        if (uVar17 < uVar41) {
          plVar32 = (long *)(pBVar9 + uVar30);
          if (*plVar32 != lVar36) goto LAB_001c13e6;
          puVar37 = (ulong *)((long)puVar51 + 9);
          puVar31 = (ulong *)(plVar32 + 1);
          puVar24 = puVar37;
          if (puVar37 < puVar1) {
            if (*puVar31 == *puVar37) {
              lVar36 = 0;
              do {
                puVar31 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar9 + lVar36 + uVar30 + 0x10);
                  puVar24 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                  goto LAB_001c16ab;
                }
                lVar38 = lVar36 + uVar30 + 0x10;
                uVar28 = *puVar31;
                lVar36 = lVar36 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar28);
              uVar28 = uVar28 ^ *(ulong *)(pBVar9 + lVar38);
              uVar39 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar28 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
            }
            else {
              uVar39 = *puVar37 ^ *puVar31;
              uVar28 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = uVar28 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c16ab:
            if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar24 < iEnd) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24));
            }
            uVar28 = (long)puVar24 - (long)puVar37;
          }
          lVar36 = uVar28 + 8;
          UVar46 = (int)puVar34 - (int)plVar32;
          if (src < puVar34) {
            piVar29 = (int *)(pBVar9 + (uVar30 - 1));
            do {
              if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c1738;
              lVar36 = lVar36 + 1;
              puVar34 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51,
                    puVar51 = puVar34, bVar16));
            goto LAB_001c1733;
          }
        }
        else {
          uVar41 = pUVar14[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)];
          if ((uVar8 < uVar41) && (*(long *)(pBVar11 + uVar41) == lVar36)) {
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar51 + 9),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            lVar36 = sVar22 + 8;
            UVar46 = UVar46 - (uVar40 + uVar41);
            if (src < puVar34) {
              piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              while (puVar34 = puVar51, (BYTE)*puVar34 == (BYTE)*piVar29) {
                lVar36 = lVar36 + 1;
                if ((piVar29 <= piVar33) ||
                   (piVar29 = (int *)((long)piVar29 + -1), puVar51 = (ulong *)((long)puVar34 + -1),
                   puVar34 <= src)) goto LAB_001c173e;
              }
              puVar34 = (ulong *)((long)puVar34 + 1);
            }
          }
          else {
LAB_001c13e6:
            puVar31 = (ulong *)((long)puVar51 + 4);
            puVar34 = (ulong *)(piVar29 + 1);
            if (uVar52 < uVar17) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)puVar31,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar22 + 4;
              UVar46 = UVar50 - uVar52;
              puVar34 = puVar51;
              if ((piVar33 < piVar29) && (src < puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + -1);
                do {
                  piVar29 = (int *)((long)piVar29 + -1);
                  if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c1738;
                  lVar36 = lVar36 + 1;
                  puVar34 = (ulong *)((long)puVar51 + -1);
                } while ((piVar33 < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16))
                ;
                goto LAB_001c1733;
              }
            }
            else {
              puVar37 = puVar31;
              if (puVar31 < puVar1) {
                if (*puVar34 == *puVar31) {
                  lVar36 = 0;
                  do {
                    puVar34 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                    if (puVar1 <= puVar34) {
                      puVar34 = (ulong *)((long)piVar29 + lVar36 + 0xc);
                      puVar37 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                      goto LAB_001c1600;
                    }
                    uVar30 = *(ulong *)((long)piVar29 + lVar36 + 0xc);
                    uVar28 = *puVar34;
                    lVar36 = lVar36 + 8;
                  } while (uVar30 == uVar28);
                  uVar28 = uVar28 ^ uVar30;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar36;
                }
                else {
                  uVar28 = *puVar31 ^ *puVar34;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c1600:
                if ((puVar37 < puVar2) && ((int)*puVar34 == (int)*puVar37)) {
                  puVar37 = (ulong *)((long)puVar37 + 4);
                  puVar34 = (ulong *)((long)puVar34 + 4);
                }
                if ((puVar37 < puVar3) && ((short)*puVar34 == (short)*puVar37)) {
                  puVar37 = (ulong *)((long)puVar37 + 2);
                  puVar34 = (ulong *)((long)puVar34 + 2);
                }
                if (puVar37 < iEnd) {
                  puVar37 = (ulong *)((long)puVar37 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar37));
                }
                uVar30 = (long)puVar37 - (long)puVar31;
              }
              lVar36 = uVar30 + 4;
              UVar46 = iVar49 - (int)piVar29;
              puVar34 = puVar51;
              if ((iStart < piVar29) && (src < puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + -1);
                do {
                  piVar29 = (int *)((long)piVar29 + -1);
                  if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c1738;
                  lVar36 = lVar36 + 1;
                  puVar34 = (ulong *)((long)puVar51 + -1);
                } while ((iStart < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
LAB_001c1733:
                puVar34 = (ulong *)((long)puVar34 + 1);
              }
            }
          }
        }
        goto LAB_001c173e;
      }
      uVar52 = pUVar15[uVar30 * -0x30e4432340650000 >> (0x40U - (char)uVar19 & 0x3f)];
      if ((uVar8 < uVar52) && (*(int *)(pBVar11 + uVar52) == (int)*puVar51)) {
        piVar29 = (int *)(pBVar11 + uVar52);
        uVar52 = uVar52 + uVar40;
        goto LAB_001c11cc;
      }
LAB_001c1286:
      puVar51 = (ulong *)((long)puVar51 + ((long)puVar51 - (long)src >> 8) + 1);
      goto LAB_001c1a4e;
    }
  }
  else if (uVar19 == 7) {
    if (puVar51 < puVar6) {
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      bVar26 = 0x40 - (char)(ms->cParams).chainLog;
      bVar27 = 0x40 - (char)(pZVar10->cParams).hashLog;
      uVar19 = (pZVar10->cParams).chainLog;
      puVar1 = (ulong *)((long)iEnd - 7);
      puVar2 = (ulong *)((long)iEnd - 3);
      puVar3 = (ulong *)((long)iEnd - 1);
      puVar21 = iEnd + -4;
LAB_001c01c4:
      uVar30 = *puVar51;
      uVar39 = uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f);
      uVar44 = uVar30 * -0x30e44323405a9d00 >> (bVar26 & 0x3f);
      iVar49 = (int)puVar51;
      UVar50 = iVar49 - iVar45;
      uVar41 = pUVar12[uVar39];
      uVar28 = (ulong)uVar41;
      UVar46 = UVar50 + 1;
      uVar47 = UVar46 - local_12c;
      piVar29 = (int *)(pBVar9 + uVar47);
      if (uVar47 < uVar17) {
        piVar29 = (int *)(pBVar11 + (uVar47 - uVar40));
      }
      uVar52 = pUVar13[uVar44];
      pUVar13[uVar44] = UVar50;
      pUVar12[uVar39] = UVar50;
      if ((uVar47 - uVar17 < 0xfffffffd) && (*piVar29 == *(int *)((long)puVar51 + 1))) {
        puVar34 = (ulong *)((long)puVar51 + 1);
        puVar31 = iEnd;
        if (uVar47 < uVar17) {
          puVar31 = mEnd;
        }
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar51 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar31,(BYTE *)iStart);
        uVar30 = (long)puVar34 - (long)src;
        puVar51 = (ulong *)seqStore->lit;
        if (puVar21 < puVar34) {
          puVar31 = puVar51;
          puVar37 = (ulong *)src;
          if (src <= puVar21) {
            puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
            uVar28 = *(ulong *)((long)src + 8);
            *puVar51 = *src;
            puVar51[1] = uVar28;
            puVar37 = puVar21;
            if (0x10 < (long)puVar21 - (long)src) {
              lVar36 = 0x10;
              do {
                uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
                puVar4 = (undefined8 *)((long)puVar51 + lVar36);
                *puVar4 = *(undefined8 *)((long)src + lVar36);
                puVar4[1] = uVar18;
                pBVar35 = (BYTE *)((long)src + lVar36 + 0x10);
                uVar18 = *(undefined8 *)(pBVar35 + 8);
                puVar4[2] = *(undefined8 *)pBVar35;
                puVar4[3] = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (puVar4 + 4 < puVar31);
            }
          }
          if (puVar37 < puVar34) {
            lVar36 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar36) = *(BYTE *)((long)puVar37 + lVar36);
              lVar36 = lVar36 + 1;
            } while ((long)puVar34 - (long)puVar37 != lVar36);
          }
LAB_001c063d:
          seqStore->lit = seqStore->lit + uVar30;
          psVar54 = seqStore->sequences;
          if (0xffff < uVar30) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar28 = *(ulong *)((long)src + 8);
          *puVar51 = *src;
          puVar51[1] = uVar28;
          pBVar35 = seqStore->lit;
          if (0x10 < uVar30) {
            uVar28 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar35 + 0x18) = uVar28;
            if (0x20 < (long)uVar30) {
              lVar36 = 0;
              do {
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x20);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                pBVar5 = pBVar35 + lVar36 + 0x20;
                *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 8) = uVar18;
                pBVar7 = (BYTE *)((long)src + lVar36 + 0x30);
                uVar18 = *(undefined8 *)(pBVar7 + 8);
                *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
                *(undefined8 *)(pBVar5 + 0x18) = uVar18;
                lVar36 = lVar36 + 0x20;
              } while (pBVar5 + 0x20 < pBVar35 + uVar30);
            }
            goto LAB_001c063d;
          }
          seqStore->lit = pBVar35 + uVar30;
          psVar54 = seqStore->sequences;
        }
        lVar36 = sVar22 + 4;
        uVar28 = sVar22 + 1;
        psVar54->litLength = (U16)uVar30;
        psVar54->offset = 1;
        UVar46 = local_12c;
        goto joined_r0x001c07d5;
      }
      puVar34 = puVar51;
      if (uVar41 <= uVar17) {
        uVar41 = pUVar14[uVar30 * -0x30e44323485a9b9d >> (bVar27 & 0x3f)];
        if ((uVar41 <= uVar8) || (*(ulong *)(pBVar11 + uVar41) != uVar30)) goto LAB_001c049f;
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)(puVar51 + 1),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar36 = sVar22 + 8;
        UVar46 = UVar50 - (uVar40 + uVar41);
        if (src < puVar51) {
          piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
          puVar51 = (ulong *)((long)puVar51 + -1);
          do {
            if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c0a73;
            lVar36 = lVar36 + 1;
            puVar34 = (ulong *)((long)puVar51 + -1);
          } while ((piVar33 < piVar29) &&
                  (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                  bVar16));
          goto LAB_001c0a6e;
        }
        goto LAB_001c0a79;
      }
      puVar31 = (ulong *)(pBVar9 + uVar28);
      if (*puVar31 == uVar30) {
        puVar24 = puVar51 + 1;
        puVar37 = puVar31 + 1;
        puVar23 = puVar24;
        if (puVar24 < puVar1) {
          if (*puVar37 == *puVar24) {
            lVar36 = 0;
            do {
              puVar37 = (ulong *)((long)puVar51 + lVar36 + 0x10);
              if (puVar1 <= puVar37) {
                puVar37 = (ulong *)(pBVar9 + lVar36 + uVar28 + 0x10);
                puVar23 = (ulong *)((long)puVar51 + lVar36 + 0x10);
                goto LAB_001c085f;
              }
              lVar38 = lVar36 + uVar28 + 0x10;
              uVar30 = *puVar37;
              lVar36 = lVar36 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar30);
            uVar30 = uVar30 ^ *(ulong *)(pBVar9 + lVar38);
            uVar39 = 0;
            if (uVar30 != 0) {
              for (; (uVar30 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar30 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
          }
          else {
            uVar39 = *puVar24 ^ *puVar37;
            uVar30 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c085f:
          if ((puVar23 < puVar2) && ((int)*puVar37 == (int)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar23 < puVar3) && ((short)*puVar37 == (short)*puVar23)) {
            puVar23 = (ulong *)((long)puVar23 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar23 < iEnd) {
            puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar23));
          }
          uVar30 = (long)puVar23 - (long)puVar24;
        }
        lVar36 = uVar30 + 8;
        UVar46 = iVar49 - (int)puVar31;
        if (puVar51 <= src) goto LAB_001c0a79;
        piVar29 = (int *)(pBVar9 + (uVar28 - 1));
        puVar51 = (ulong *)((long)puVar51 + -1);
        do {
          if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c0a73;
          lVar36 = lVar36 + 1;
          puVar34 = (ulong *)((long)puVar51 + -1);
        } while ((iStart < piVar29) &&
                (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                bVar16));
        goto LAB_001c0a6e;
      }
LAB_001c049f:
      if (uVar17 < uVar52) {
        piVar29 = (int *)(pBVar9 + uVar52);
        if (*piVar29 != (int)*puVar51) goto LAB_001c05c3;
LAB_001c0509:
        lVar36 = *(long *)((long)puVar51 + 1);
        uVar28 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f);
        puVar34 = (ulong *)((long)puVar51 + 1);
        uVar41 = pUVar12[uVar28];
        uVar30 = (ulong)uVar41;
        pUVar12[uVar28] = UVar46;
        if (uVar17 < uVar41) {
          plVar32 = (long *)(pBVar9 + uVar30);
          if (*plVar32 != lVar36) goto LAB_001c0723;
          puVar37 = (ulong *)((long)puVar51 + 9);
          puVar31 = (ulong *)(plVar32 + 1);
          puVar24 = puVar37;
          if (puVar37 < puVar1) {
            if (*puVar31 == *puVar37) {
              lVar36 = 0;
              do {
                puVar31 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                if (puVar1 <= puVar31) {
                  puVar31 = (ulong *)(pBVar9 + lVar36 + uVar30 + 0x10);
                  puVar24 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                  goto LAB_001c09e6;
                }
                lVar38 = lVar36 + uVar30 + 0x10;
                uVar28 = *puVar31;
                lVar36 = lVar36 + 8;
              } while (*(ulong *)(pBVar9 + lVar38) == uVar28);
              uVar28 = uVar28 ^ *(ulong *)(pBVar9 + lVar38);
              uVar39 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar28 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
            }
            else {
              uVar39 = *puVar37 ^ *puVar31;
              uVar28 = 0;
              if (uVar39 != 0) {
                for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = uVar28 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c09e6:
            if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 4);
              puVar31 = (ulong *)((long)puVar31 + 4);
            }
            if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
              puVar24 = (ulong *)((long)puVar24 + 2);
              puVar31 = (ulong *)((long)puVar31 + 2);
            }
            if (puVar24 < iEnd) {
              puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24));
            }
            uVar28 = (long)puVar24 - (long)puVar37;
          }
          lVar36 = uVar28 + 8;
          UVar46 = (int)puVar34 - (int)plVar32;
          if (src < puVar34) {
            piVar29 = (int *)(pBVar9 + (uVar30 - 1));
            do {
              if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c0a73;
              lVar36 = lVar36 + 1;
              puVar34 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar29) &&
                    (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51,
                    puVar51 = puVar34, bVar16));
            goto LAB_001c0a6e;
          }
        }
        else {
          uVar41 = pUVar14[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)];
          if ((uVar8 < uVar41) && (*(long *)(pBVar11 + uVar41) == lVar36)) {
            sVar22 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar51 + 9),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                                (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
            lVar36 = sVar22 + 8;
            UVar46 = UVar46 - (uVar40 + uVar41);
            if (src < puVar34) {
              piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              while (puVar34 = puVar51, (BYTE)*puVar34 == (BYTE)*piVar29) {
                lVar36 = lVar36 + 1;
                if ((piVar29 <= piVar33) ||
                   (piVar29 = (int *)((long)piVar29 + -1), puVar51 = (ulong *)((long)puVar34 + -1),
                   puVar34 <= src)) goto LAB_001c0a79;
              }
              puVar34 = (ulong *)((long)puVar34 + 1);
            }
          }
          else {
LAB_001c0723:
            puVar31 = (ulong *)((long)puVar51 + 4);
            puVar34 = (ulong *)(piVar29 + 1);
            if (uVar52 < uVar17) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)puVar31,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                                  (BYTE *)iStart);
              lVar36 = sVar22 + 4;
              UVar46 = UVar50 - uVar52;
              puVar34 = puVar51;
              if ((piVar33 < piVar29) && (src < puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + -1);
                do {
                  piVar29 = (int *)((long)piVar29 + -1);
                  if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c0a73;
                  lVar36 = lVar36 + 1;
                  puVar34 = (ulong *)((long)puVar51 + -1);
                } while ((piVar33 < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16))
                ;
                goto LAB_001c0a6e;
              }
            }
            else {
              puVar37 = puVar31;
              if (puVar31 < puVar1) {
                if (*puVar34 == *puVar31) {
                  lVar36 = 0;
                  do {
                    puVar34 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                    if (puVar1 <= puVar34) {
                      puVar34 = (ulong *)((long)piVar29 + lVar36 + 0xc);
                      puVar37 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                      goto LAB_001c093b;
                    }
                    uVar30 = *(ulong *)((long)piVar29 + lVar36 + 0xc);
                    uVar28 = *puVar34;
                    lVar36 = lVar36 + 8;
                  } while (uVar30 == uVar28);
                  uVar28 = uVar28 ^ uVar30;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar36;
                }
                else {
                  uVar28 = *puVar31 ^ *puVar34;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_001c093b:
                if ((puVar37 < puVar2) && ((int)*puVar34 == (int)*puVar37)) {
                  puVar37 = (ulong *)((long)puVar37 + 4);
                  puVar34 = (ulong *)((long)puVar34 + 4);
                }
                if ((puVar37 < puVar3) && ((short)*puVar34 == (short)*puVar37)) {
                  puVar37 = (ulong *)((long)puVar37 + 2);
                  puVar34 = (ulong *)((long)puVar34 + 2);
                }
                if (puVar37 < iEnd) {
                  puVar37 = (ulong *)((long)puVar37 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar37));
                }
                uVar30 = (long)puVar37 - (long)puVar31;
              }
              lVar36 = uVar30 + 4;
              UVar46 = iVar49 - (int)piVar29;
              puVar34 = puVar51;
              if ((iStart < piVar29) && (src < puVar51)) {
                puVar51 = (ulong *)((long)puVar51 + -1);
                do {
                  piVar29 = (int *)((long)piVar29 + -1);
                  if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c0a73;
                  lVar36 = lVar36 + 1;
                  puVar34 = (ulong *)((long)puVar51 + -1);
                } while ((iStart < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
LAB_001c0a6e:
                puVar34 = (ulong *)((long)puVar34 + 1);
              }
            }
          }
        }
        goto LAB_001c0a79;
      }
      uVar52 = pUVar15[uVar30 * -0x30e44323405a9d00 >> (0x40U - (char)uVar19 & 0x3f)];
      if ((uVar8 < uVar52) && (*(int *)(pBVar11 + uVar52) == (int)*puVar51)) {
        piVar29 = (int *)(pBVar11 + uVar52);
        uVar52 = uVar52 + uVar40;
        goto LAB_001c0509;
      }
LAB_001c05c3:
      puVar51 = (ulong *)((long)puVar51 + ((long)puVar51 - (long)src >> 8) + 1);
      goto LAB_001c0d89;
    }
  }
  else if (puVar51 < puVar6) {
    bVar25 = 0x40 - (char)(ms->cParams).hashLog;
    bVar26 = 0x20 - (char)(ms->cParams).chainLog;
    bVar27 = 0x40 - (char)(pZVar10->cParams).hashLog;
    uVar19 = (pZVar10->cParams).chainLog;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar21 = iEnd + -4;
LAB_001c27c6:
    uVar47 = (int)*puVar51 * -0x61c8864f;
    uVar28 = *puVar51 * -0x30e44323485a9b9d;
    uVar39 = uVar28 >> (bVar25 & 0x3f);
    uVar52 = uVar47 >> (bVar26 & 0x1f);
    iVar49 = (int)puVar51;
    UVar50 = iVar49 - iVar45;
    uVar41 = pUVar12[uVar39];
    uVar30 = (ulong)uVar41;
    UVar46 = UVar50 + 1;
    uVar42 = UVar46 - local_12c;
    piVar29 = (int *)(pBVar9 + uVar42);
    if (uVar42 < uVar17) {
      piVar29 = (int *)(pBVar11 + (uVar42 - uVar40));
    }
    uVar53 = pUVar13[uVar52];
    pUVar13[uVar52] = UVar50;
    pUVar12[uVar39] = UVar50;
    if ((uVar42 - uVar17 < 0xfffffffd) && (*piVar29 == *(int *)((long)puVar51 + 1))) {
      puVar34 = (ulong *)((long)puVar51 + 1);
      puVar31 = iEnd;
      if (uVar42 < uVar17) {
        puVar31 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar51 + 5),(BYTE *)(piVar29 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar31,(BYTE *)iStart);
      uVar30 = (long)puVar34 - (long)src;
      puVar51 = (ulong *)seqStore->lit;
      if (puVar21 < puVar34) {
        puVar31 = puVar51;
        puVar37 = (ulong *)src;
        if (src <= puVar21) {
          puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
          uVar28 = *(ulong *)((long)src + 8);
          *puVar51 = *src;
          puVar51[1] = uVar28;
          puVar37 = puVar21;
          if (0x10 < (long)puVar21 - (long)src) {
            lVar36 = 0x10;
            do {
              uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar36) + 8);
              puVar4 = (undefined8 *)((long)puVar51 + lVar36);
              *puVar4 = *(undefined8 *)((long)src + lVar36);
              puVar4[1] = uVar18;
              pBVar35 = (BYTE *)((long)src + lVar36 + 0x10);
              uVar18 = *(undefined8 *)(pBVar35 + 8);
              puVar4[2] = *(undefined8 *)pBVar35;
              puVar4[3] = uVar18;
              lVar36 = lVar36 + 0x20;
            } while (puVar4 + 4 < puVar31);
          }
        }
        if (puVar37 < puVar34) {
          lVar36 = 0;
          do {
            *(BYTE *)((long)puVar31 + lVar36) = *(BYTE *)((long)puVar37 + lVar36);
            lVar36 = lVar36 + 1;
          } while ((long)puVar34 - (long)puVar37 != lVar36);
        }
LAB_001c2c2e:
        seqStore->lit = seqStore->lit + uVar30;
        psVar54 = seqStore->sequences;
        if (0xffff < uVar30) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar28 = *(ulong *)((long)src + 8);
        *puVar51 = *src;
        puVar51[1] = uVar28;
        pBVar35 = seqStore->lit;
        if (0x10 < uVar30) {
          uVar28 = *(ulong *)((long)src + 0x18);
          *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
          *(ulong *)(pBVar35 + 0x18) = uVar28;
          if (0x20 < (long)uVar30) {
            lVar36 = 0;
            do {
              pBVar7 = (BYTE *)((long)src + lVar36 + 0x20);
              uVar18 = *(undefined8 *)(pBVar7 + 8);
              pBVar5 = pBVar35 + lVar36 + 0x20;
              *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
              *(undefined8 *)(pBVar5 + 8) = uVar18;
              pBVar7 = (BYTE *)((long)src + lVar36 + 0x30);
              uVar18 = *(undefined8 *)(pBVar7 + 8);
              *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
              *(undefined8 *)(pBVar5 + 0x18) = uVar18;
              lVar36 = lVar36 + 0x20;
            } while (pBVar5 + 0x20 < pBVar35 + uVar30);
          }
          goto LAB_001c2c2e;
        }
        seqStore->lit = pBVar35 + uVar30;
        psVar54 = seqStore->sequences;
      }
      lVar36 = sVar22 + 4;
      uVar28 = sVar22 + 1;
      psVar54->litLength = (U16)uVar30;
      psVar54->offset = 1;
      UVar46 = local_12c;
      goto joined_r0x001c2dbe;
    }
    puVar34 = puVar51;
    if (uVar41 <= uVar17) {
      uVar41 = pUVar14[uVar28 >> (bVar27 & 0x3f)];
      if ((uVar41 <= uVar8) || (*(ulong *)(pBVar11 + uVar41) != *puVar51)) goto LAB_001c2a89;
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)(puVar51 + 1),(BYTE *)((long)(pBVar11 + uVar41) + 8),(BYTE *)iEnd,
                          (BYTE *)mEnd,(BYTE *)iStart);
      lVar36 = sVar22 + 8;
      UVar46 = UVar50 - (uVar40 + uVar41);
      if (src < puVar51) {
        piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
        puVar51 = (ulong *)((long)puVar51 + -1);
        do {
          if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c3054;
          lVar36 = lVar36 + 1;
          puVar34 = (ulong *)((long)puVar51 + -1);
        } while ((piVar33 < piVar29) &&
                (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                bVar16));
        goto LAB_001c304f;
      }
      goto LAB_001c305a;
    }
    puVar31 = (ulong *)(pBVar9 + uVar30);
    if (*puVar31 == *puVar51) {
      puVar24 = puVar51 + 1;
      puVar37 = puVar31 + 1;
      puVar23 = puVar24;
      if (puVar24 < puVar1) {
        if (*puVar37 == *puVar24) {
          lVar36 = 0;
          do {
            puVar37 = (ulong *)((long)puVar51 + lVar36 + 0x10);
            if (puVar1 <= puVar37) {
              puVar37 = (ulong *)(pBVar9 + lVar36 + uVar30 + 0x10);
              puVar23 = (ulong *)((long)puVar51 + lVar36 + 0x10);
              goto LAB_001c2e4b;
            }
            lVar38 = lVar36 + uVar30 + 0x10;
            uVar28 = *puVar37;
            lVar36 = lVar36 + 8;
          } while (*(ulong *)(pBVar9 + lVar38) == uVar28);
          uVar28 = uVar28 ^ *(ulong *)(pBVar9 + lVar38);
          uVar39 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
            }
          }
          uVar28 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar39 = *puVar24 ^ *puVar37;
          uVar28 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
            }
          }
          uVar28 = uVar28 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c2e4b:
        if ((puVar23 < puVar2) && ((int)*puVar37 == (int)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 4);
          puVar37 = (ulong *)((long)puVar37 + 4);
        }
        if ((puVar23 < puVar3) && ((short)*puVar37 == (short)*puVar23)) {
          puVar23 = (ulong *)((long)puVar23 + 2);
          puVar37 = (ulong *)((long)puVar37 + 2);
        }
        if (puVar23 < iEnd) {
          puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar23));
        }
        uVar28 = (long)puVar23 - (long)puVar24;
      }
      lVar36 = uVar28 + 8;
      UVar46 = iVar49 - (int)puVar31;
      if (puVar51 <= src) goto LAB_001c305a;
      piVar29 = (int *)(pBVar9 + (uVar30 - 1));
      puVar51 = (ulong *)((long)puVar51 + -1);
      do {
        if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c3054;
        lVar36 = lVar36 + 1;
        puVar34 = (ulong *)((long)puVar51 + -1);
      } while ((iStart < piVar29) &&
              (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
              bVar16));
      goto LAB_001c304f;
    }
LAB_001c2a89:
    if (uVar17 < uVar53) {
      piVar29 = (int *)(pBVar9 + uVar53);
      if (*piVar29 != (int)*puVar51) goto LAB_001c2bb6;
LAB_001c2ae9:
      lVar36 = *(long *)((long)puVar51 + 1);
      uVar28 = (ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f);
      puVar34 = (ulong *)((long)puVar51 + 1);
      uVar41 = pUVar12[uVar28];
      uVar30 = (ulong)uVar41;
      pUVar12[uVar28] = UVar46;
      if (uVar41 <= uVar17) {
        uVar41 = pUVar14[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar27 & 0x3f)];
        if ((uVar41 <= uVar8) || (*(long *)(pBVar11 + uVar41) != lVar36)) goto LAB_001c2d0c;
        sVar22 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar51 + 9),(BYTE *)((long)(pBVar11 + uVar41) + 8),
                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
        lVar36 = sVar22 + 8;
        UVar46 = UVar46 - (uVar40 + uVar41);
        if (src < puVar34) {
          piVar29 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
          do {
            if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c3054;
            lVar36 = lVar36 + 1;
            puVar34 = (ulong *)((long)puVar51 + -1);
          } while ((piVar33 < piVar29) &&
                  (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                  bVar16));
          goto LAB_001c304f;
        }
        goto LAB_001c305a;
      }
      plVar32 = (long *)(pBVar9 + uVar30);
      if (*plVar32 == lVar36) {
        puVar37 = (ulong *)((long)puVar51 + 9);
        puVar31 = (ulong *)(plVar32 + 1);
        puVar24 = puVar37;
        if (puVar37 < puVar1) {
          if (*puVar31 == *puVar37) {
            lVar36 = 0;
            do {
              puVar31 = (ulong *)((long)puVar51 + lVar36 + 0x11);
              if (puVar1 <= puVar31) {
                puVar31 = (ulong *)(pBVar9 + lVar36 + uVar30 + 0x10);
                puVar24 = (ulong *)((long)puVar51 + lVar36 + 0x11);
                goto LAB_001c2fc9;
              }
              lVar38 = lVar36 + uVar30 + 0x10;
              uVar28 = *puVar31;
              lVar36 = lVar36 + 8;
            } while (*(ulong *)(pBVar9 + lVar38) == uVar28);
            uVar28 = uVar28 ^ *(ulong *)(pBVar9 + lVar38);
            uVar39 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar28 = (uVar39 >> 3 & 0x1fffffff) + lVar36;
          }
          else {
            uVar39 = *puVar37 ^ *puVar31;
            uVar28 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar28 = uVar28 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c2fc9:
          if ((puVar24 < puVar2) && ((int)*puVar31 == (int)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 4);
            puVar31 = (ulong *)((long)puVar31 + 4);
          }
          if ((puVar24 < puVar3) && ((short)*puVar31 == (short)*puVar24)) {
            puVar24 = (ulong *)((long)puVar24 + 2);
            puVar31 = (ulong *)((long)puVar31 + 2);
          }
          if (puVar24 < iEnd) {
            puVar24 = (ulong *)((long)puVar24 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar24));
          }
          uVar28 = (long)puVar24 - (long)puVar37;
        }
        lVar36 = uVar28 + 8;
        UVar46 = (int)puVar34 - (int)plVar32;
        if (puVar34 <= src) goto LAB_001c305a;
        piVar29 = (int *)(pBVar9 + (uVar30 - 1));
        do {
          if ((BYTE)*puVar51 != (BYTE)*piVar29) goto LAB_001c3054;
          lVar36 = lVar36 + 1;
          puVar34 = (ulong *)((long)puVar51 + -1);
        } while ((iStart < piVar29) &&
                (piVar29 = (int *)((long)piVar29 + -1), bVar16 = src < puVar51, puVar51 = puVar34,
                bVar16));
LAB_001c304f:
        puVar34 = (ulong *)((long)puVar34 + 1);
      }
      else {
LAB_001c2d0c:
        puVar31 = (ulong *)((long)puVar51 + 4);
        puVar34 = (ulong *)(piVar29 + 1);
        if (uVar53 < uVar17) {
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)puVar31,(BYTE *)puVar34,(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          lVar36 = sVar22 + 4;
          UVar46 = UVar50 - uVar53;
          puVar34 = puVar51;
          if ((piVar33 < piVar29) && (src < puVar51)) {
            puVar51 = (ulong *)((long)puVar51 + -1);
            do {
              piVar29 = (int *)((long)piVar29 + -1);
              if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c3054;
              lVar36 = lVar36 + 1;
              puVar34 = (ulong *)((long)puVar51 + -1);
            } while ((piVar33 < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
            goto LAB_001c304f;
          }
        }
        else {
          puVar37 = puVar31;
          if (puVar31 < puVar1) {
            if (*puVar34 == *puVar31) {
              lVar36 = 0;
              do {
                puVar34 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                if (puVar1 <= puVar34) {
                  puVar34 = (ulong *)((long)piVar29 + lVar36 + 0xc);
                  puVar37 = (ulong *)((long)puVar51 + lVar36 + 0xc);
                  goto LAB_001c2f21;
                }
                uVar30 = *(ulong *)((long)piVar29 + lVar36 + 0xc);
                uVar28 = *puVar34;
                lVar36 = lVar36 + 8;
              } while (uVar30 == uVar28);
              uVar28 = uVar28 ^ uVar30;
              uVar30 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = (uVar30 >> 3 & 0x1fffffff) + lVar36;
            }
            else {
              uVar28 = *puVar31 ^ *puVar34;
              uVar30 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              uVar30 = uVar30 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c2f21:
            if ((puVar37 < puVar2) && ((int)*puVar34 == (int)*puVar37)) {
              puVar37 = (ulong *)((long)puVar37 + 4);
              puVar34 = (ulong *)((long)puVar34 + 4);
            }
            if ((puVar37 < puVar3) && ((short)*puVar34 == (short)*puVar37)) {
              puVar37 = (ulong *)((long)puVar37 + 2);
              puVar34 = (ulong *)((long)puVar34 + 2);
            }
            if (puVar37 < iEnd) {
              puVar37 = (ulong *)((long)puVar37 + (ulong)((BYTE)*puVar34 == (BYTE)*puVar37));
            }
            uVar30 = (long)puVar37 - (long)puVar31;
          }
          lVar36 = uVar30 + 4;
          UVar46 = iVar49 - (int)piVar29;
          puVar34 = puVar51;
          if ((iStart < piVar29) && (src < puVar51)) {
            puVar51 = (ulong *)((long)puVar51 + -1);
            do {
              piVar29 = (int *)((long)piVar29 + -1);
              if ((BYTE)*puVar51 != *(BYTE *)piVar29) goto LAB_001c3054;
              lVar36 = lVar36 + 1;
              puVar34 = (ulong *)((long)puVar51 + -1);
            } while ((iStart < piVar29) && (bVar16 = src < puVar51, puVar51 = puVar34, bVar16));
            goto LAB_001c304f;
          }
        }
      }
      goto LAB_001c305a;
    }
    uVar53 = pUVar15[uVar47 >> (0x20U - (char)uVar19 & 0x1f)];
    if ((uVar8 < uVar53) && (*(int *)(pBVar11 + uVar53) == (int)*puVar51)) {
      piVar29 = (int *)(pBVar11 + uVar53);
      uVar53 = uVar53 + uVar40;
      goto LAB_001c2ae9;
    }
LAB_001c2bb6:
    puVar51 = (ulong *)((long)puVar51 + ((long)puVar51 - (long)src >> 8) + 1);
    goto LAB_001c3350;
  }
LAB_001c3360:
  *rep = local_12c;
  rep[1] = UVar48;
  return (long)iEnd - (long)src;
LAB_001c23d8:
  puVar34 = (ulong *)((long)puVar51 + 1);
LAB_001c23de:
  uVar30 = (long)puVar34 - (long)src;
  puVar51 = (ulong *)seqStore->lit;
  if (puVar21 < puVar34) {
    puVar31 = puVar51;
    puVar37 = (ulong *)src;
    if (src <= puVar21) {
      puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar28;
      puVar37 = puVar21;
      if (0x10 < (long)puVar21 - (long)src) {
        lVar38 = 0x10;
        do {
          uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar38) + 8);
          puVar4 = (undefined8 *)((long)puVar51 + lVar38);
          *puVar4 = *(undefined8 *)((long)src + lVar38);
          puVar4[1] = uVar18;
          pBVar35 = (BYTE *)((long)src + lVar38 + 0x10);
          uVar18 = *(undefined8 *)(pBVar35 + 8);
          puVar4[2] = *(undefined8 *)pBVar35;
          puVar4[3] = uVar18;
          lVar38 = lVar38 + 0x20;
        } while (puVar4 + 4 < puVar31);
      }
    }
    if (puVar37 < puVar34) {
      lVar38 = 0;
      do {
        *(BYTE *)((long)puVar31 + lVar38) = *(BYTE *)((long)puVar37 + lVar38);
        lVar38 = lVar38 + 1;
      } while ((long)puVar34 - (long)puVar37 != lVar38);
    }
  }
  else {
    uVar28 = *(ulong *)((long)src + 8);
    *puVar51 = *src;
    puVar51[1] = uVar28;
    pBVar35 = seqStore->lit;
    if (uVar30 < 0x11) {
      seqStore->lit = pBVar35 + uVar30;
      psVar54 = seqStore->sequences;
      goto LAB_001c24f9;
    }
    uVar28 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar35 + 0x18) = uVar28;
    if (0x20 < (long)uVar30) {
      lVar38 = 0;
      do {
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x20);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        pBVar5 = pBVar35 + lVar38 + 0x20;
        *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 8) = uVar18;
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x30);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar5 + 0x20 < pBVar35 + uVar30);
    }
  }
  seqStore->lit = seqStore->lit + uVar30;
  psVar54 = seqStore->sequences;
  if (0xffff < uVar30) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001c24f9:
  uVar28 = lVar36 - 3;
  psVar54->litLength = (U16)uVar30;
  psVar54->offset = UVar46 + 3;
  UVar48 = local_12c;
joined_r0x001c2143:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar36 + (long)puVar34);
  psVar54->matchLength = (U16)uVar28;
  psVar54 = psVar54 + 1;
  seqStore->sequences = psVar54;
  puVar51 = (ulong *)src;
  local_12c = UVar46;
  if (src <= puVar6) {
    uVar41 = UVar50 + 2;
    lVar36 = *(long *)(pBVar9 + uVar41);
    pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
         ((int)src + -2) - iVar45;
    pUVar13[(ulong)(lVar36 * -0x30e4432345000000) >> (bVar26 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar26 & 0x3f)] =
         ((int)src + -1) - iVar45;
    UVar50 = UVar48;
    do {
      UVar20 = UVar46;
      UVar46 = (int)src - iVar45;
      uVar41 = UVar46 - UVar50;
      pBVar35 = pBVar9;
      if (uVar41 < uVar17) {
        pBVar35 = pBVar11 + -uVar43;
      }
      puVar51 = (ulong *)src;
      UVar48 = UVar50;
      local_12c = UVar20;
      if ((0xfffffffc < uVar41 - uVar17) || (*(int *)(pBVar35 + uVar41) != (int)*src)) break;
      puVar51 = iEnd;
      if (uVar41 < uVar17) {
        puVar51 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar51,(BYTE *)iStart);
      if (src <= puVar21) {
        puVar51 = (ulong *)seqStore->lit;
        uVar30 = *(ulong *)((long)src + 8);
        *puVar51 = *src;
        puVar51[1] = uVar30;
        psVar54 = seqStore->sequences;
      }
      psVar54->litLength = 0;
      psVar54->offset = 1;
      if (0xffff < sVar22 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar54->matchLength = (U16)(sVar22 + 1);
      psVar54 = psVar54 + 1;
      seqStore->sequences = psVar54;
      uVar30 = *src;
      pUVar13[uVar30 * -0x30e4432345000000 >> (bVar26 & 0x3f)] = UVar46;
      pUVar12[uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar46;
      src = (void *)((long)src + sVar22 + 4);
      puVar51 = (ulong *)src;
      UVar48 = UVar20;
      local_12c = UVar50;
      UVar46 = UVar50;
      UVar50 = UVar20;
    } while (src <= puVar6);
  }
LAB_001c26f4:
  if (puVar6 <= puVar51) goto LAB_001c3360;
  goto LAB_001c1b4e;
LAB_001c1738:
  puVar34 = (ulong *)((long)puVar51 + 1);
LAB_001c173e:
  uVar30 = (long)puVar34 - (long)src;
  puVar51 = (ulong *)seqStore->lit;
  if (puVar21 < puVar34) {
    puVar31 = puVar51;
    puVar37 = (ulong *)src;
    if (src <= puVar21) {
      puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar28;
      puVar37 = puVar21;
      if (0x10 < (long)puVar21 - (long)src) {
        lVar38 = 0x10;
        do {
          uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar38) + 8);
          puVar4 = (undefined8 *)((long)puVar51 + lVar38);
          *puVar4 = *(undefined8 *)((long)src + lVar38);
          puVar4[1] = uVar18;
          pBVar35 = (BYTE *)((long)src + lVar38 + 0x10);
          uVar18 = *(undefined8 *)(pBVar35 + 8);
          puVar4[2] = *(undefined8 *)pBVar35;
          puVar4[3] = uVar18;
          lVar38 = lVar38 + 0x20;
        } while (puVar4 + 4 < puVar31);
      }
    }
    if (puVar37 < puVar34) {
      lVar38 = 0;
      do {
        *(BYTE *)((long)puVar31 + lVar38) = *(BYTE *)((long)puVar37 + lVar38);
        lVar38 = lVar38 + 1;
      } while ((long)puVar34 - (long)puVar37 != lVar38);
    }
  }
  else {
    uVar28 = *(ulong *)((long)src + 8);
    *puVar51 = *src;
    puVar51[1] = uVar28;
    pBVar35 = seqStore->lit;
    if (uVar30 < 0x11) {
      seqStore->lit = pBVar35 + uVar30;
      psVar54 = seqStore->sequences;
      goto LAB_001c1850;
    }
    uVar28 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar35 + 0x18) = uVar28;
    if (0x20 < (long)uVar30) {
      lVar38 = 0;
      do {
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x20);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        pBVar5 = pBVar35 + lVar38 + 0x20;
        *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 8) = uVar18;
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x30);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar5 + 0x20 < pBVar35 + uVar30);
    }
  }
  seqStore->lit = seqStore->lit + uVar30;
  psVar54 = seqStore->sequences;
  if (0xffff < uVar30) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001c1850:
  uVar28 = lVar36 - 3;
  psVar54->litLength = (U16)uVar30;
  psVar54->offset = UVar46 + 3;
  UVar48 = local_12c;
joined_r0x001c149a:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar36 + (long)puVar34);
  psVar54->matchLength = (U16)uVar28;
  psVar54 = psVar54 + 1;
  seqStore->sequences = psVar54;
  puVar51 = (ulong *)src;
  local_12c = UVar46;
  if (src <= puVar6) {
    uVar41 = UVar50 + 2;
    lVar36 = *(long *)(pBVar9 + uVar41);
    pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
         ((int)src + -2) - iVar45;
    pUVar13[(ulong)(lVar36 * -0x30e4432340650000) >> (bVar26 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar26 & 0x3f)] =
         ((int)src + -1) - iVar45;
    UVar50 = UVar48;
    do {
      UVar20 = UVar46;
      UVar46 = (int)src - iVar45;
      uVar41 = UVar46 - UVar50;
      pBVar35 = pBVar9;
      if (uVar41 < uVar17) {
        pBVar35 = pBVar11 + -uVar43;
      }
      puVar51 = (ulong *)src;
      UVar48 = UVar50;
      local_12c = UVar20;
      if ((0xfffffffc < uVar41 - uVar17) || (*(int *)(pBVar35 + uVar41) != (int)*src)) break;
      puVar51 = iEnd;
      if (uVar41 < uVar17) {
        puVar51 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar51,(BYTE *)iStart);
      if (src <= puVar21) {
        puVar51 = (ulong *)seqStore->lit;
        uVar30 = *(ulong *)((long)src + 8);
        *puVar51 = *src;
        puVar51[1] = uVar30;
        psVar54 = seqStore->sequences;
      }
      psVar54->litLength = 0;
      psVar54->offset = 1;
      if (0xffff < sVar22 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar54->matchLength = (U16)(sVar22 + 1);
      psVar54 = psVar54 + 1;
      seqStore->sequences = psVar54;
      uVar30 = *src;
      pUVar13[uVar30 * -0x30e4432340650000 >> (bVar26 & 0x3f)] = UVar46;
      pUVar12[uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar46;
      src = (void *)((long)src + sVar22 + 4);
      puVar51 = (ulong *)src;
      UVar48 = UVar20;
      local_12c = UVar50;
      UVar46 = UVar50;
      UVar50 = UVar20;
    } while (src <= puVar6);
  }
LAB_001c1a4e:
  if (puVar6 <= puVar51) goto LAB_001c3360;
  goto LAB_001c0e89;
LAB_001c3054:
  puVar34 = (ulong *)((long)puVar51 + 1);
LAB_001c305a:
  uVar30 = (long)puVar34 - (long)src;
  puVar51 = (ulong *)seqStore->lit;
  if (puVar21 < puVar34) {
    puVar31 = puVar51;
    puVar37 = (ulong *)src;
    if (src <= puVar21) {
      puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar28;
      puVar37 = puVar21;
      if (0x10 < (long)puVar21 - (long)src) {
        lVar38 = 0x10;
        do {
          uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar38) + 8);
          puVar4 = (undefined8 *)((long)puVar51 + lVar38);
          *puVar4 = *(undefined8 *)((long)src + lVar38);
          puVar4[1] = uVar18;
          pBVar35 = (BYTE *)((long)src + lVar38 + 0x10);
          uVar18 = *(undefined8 *)(pBVar35 + 8);
          puVar4[2] = *(undefined8 *)pBVar35;
          puVar4[3] = uVar18;
          lVar38 = lVar38 + 0x20;
        } while (puVar4 + 4 < puVar31);
      }
    }
    if (puVar37 < puVar34) {
      lVar38 = 0;
      do {
        *(BYTE *)((long)puVar31 + lVar38) = *(BYTE *)((long)puVar37 + lVar38);
        lVar38 = lVar38 + 1;
      } while ((long)puVar34 - (long)puVar37 != lVar38);
    }
  }
  else {
    uVar28 = *(ulong *)((long)src + 8);
    *puVar51 = *src;
    puVar51[1] = uVar28;
    pBVar35 = seqStore->lit;
    if (uVar30 < 0x11) {
      seqStore->lit = pBVar35 + uVar30;
      psVar54 = seqStore->sequences;
      goto LAB_001c3169;
    }
    uVar28 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar35 + 0x18) = uVar28;
    if (0x20 < (long)uVar30) {
      lVar38 = 0;
      do {
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x20);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        pBVar5 = pBVar35 + lVar38 + 0x20;
        *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 8) = uVar18;
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x30);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar5 + 0x20 < pBVar35 + uVar30);
    }
  }
  seqStore->lit = seqStore->lit + uVar30;
  psVar54 = seqStore->sequences;
  if (0xffff < uVar30) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001c3169:
  uVar28 = lVar36 - 3;
  psVar54->litLength = (U16)uVar30;
  psVar54->offset = UVar46 + 3;
  UVar48 = local_12c;
joined_r0x001c2dbe:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar36 + (long)puVar34);
  psVar54->matchLength = (U16)uVar28;
  psVar54 = psVar54 + 1;
  seqStore->sequences = psVar54;
  puVar51 = (ulong *)src;
  local_12c = UVar46;
  if (src <= puVar6) {
    uVar41 = UVar50 + 2;
    pUVar12[(ulong)(*(long *)(pBVar9 + uVar41) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
         ((int)src + -2) - iVar45;
    pUVar13[(uint)(*(int *)(pBVar9 + uVar41) * -0x61c8864f) >> (bVar26 & 0x1f)] = uVar41;
    pUVar13[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar26 & 0x1f)] =
         ((int)src + -1) - iVar45;
    UVar50 = UVar48;
    do {
      UVar20 = UVar46;
      UVar46 = (int)src - iVar45;
      uVar41 = UVar46 - UVar50;
      pBVar35 = pBVar9;
      if (uVar41 < uVar17) {
        pBVar35 = pBVar11 + -uVar43;
      }
      puVar51 = (ulong *)src;
      UVar48 = UVar50;
      local_12c = UVar20;
      if ((0xfffffffc < uVar41 - uVar17) || (*(int *)(pBVar35 + uVar41) != (int)*src)) break;
      puVar51 = iEnd;
      if (uVar41 < uVar17) {
        puVar51 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar51,(BYTE *)iStart);
      if (src <= puVar21) {
        puVar51 = (ulong *)seqStore->lit;
        uVar30 = *(ulong *)((long)src + 8);
        *puVar51 = *src;
        puVar51[1] = uVar30;
        psVar54 = seqStore->sequences;
      }
      psVar54->litLength = 0;
      psVar54->offset = 1;
      if (0xffff < sVar22 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar54->matchLength = (U16)(sVar22 + 1);
      psVar54 = psVar54 + 1;
      seqStore->sequences = psVar54;
      pUVar13[(uint)((int)*src * -0x61c8864f) >> (bVar26 & 0x1f)] = UVar46;
      pUVar12[*src * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar46;
      src = (void *)((long)src + sVar22 + 4);
      puVar51 = (ulong *)src;
      UVar48 = UVar20;
      local_12c = UVar50;
      UVar46 = UVar50;
      UVar50 = UVar20;
    } while (src <= puVar6);
  }
LAB_001c3350:
  if (puVar6 <= puVar51) goto LAB_001c3360;
  goto LAB_001c27c6;
LAB_001c0a73:
  puVar34 = (ulong *)((long)puVar51 + 1);
LAB_001c0a79:
  uVar30 = (long)puVar34 - (long)src;
  puVar51 = (ulong *)seqStore->lit;
  if (puVar21 < puVar34) {
    puVar31 = puVar51;
    puVar37 = (ulong *)src;
    if (src <= puVar21) {
      puVar31 = (ulong *)((long)puVar51 + ((long)puVar21 - (long)src));
      uVar28 = *(ulong *)((long)src + 8);
      *puVar51 = *src;
      puVar51[1] = uVar28;
      puVar37 = puVar21;
      if (0x10 < (long)puVar21 - (long)src) {
        lVar38 = 0x10;
        do {
          uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar38) + 8);
          puVar4 = (undefined8 *)((long)puVar51 + lVar38);
          *puVar4 = *(undefined8 *)((long)src + lVar38);
          puVar4[1] = uVar18;
          pBVar35 = (BYTE *)((long)src + lVar38 + 0x10);
          uVar18 = *(undefined8 *)(pBVar35 + 8);
          puVar4[2] = *(undefined8 *)pBVar35;
          puVar4[3] = uVar18;
          lVar38 = lVar38 + 0x20;
        } while (puVar4 + 4 < puVar31);
      }
    }
    if (puVar37 < puVar34) {
      lVar38 = 0;
      do {
        *(BYTE *)((long)puVar31 + lVar38) = *(BYTE *)((long)puVar37 + lVar38);
        lVar38 = lVar38 + 1;
      } while ((long)puVar34 - (long)puVar37 != lVar38);
    }
  }
  else {
    uVar28 = *(ulong *)((long)src + 8);
    *puVar51 = *src;
    puVar51[1] = uVar28;
    pBVar35 = seqStore->lit;
    if (uVar30 < 0x11) {
      seqStore->lit = pBVar35 + uVar30;
      psVar54 = seqStore->sequences;
      goto LAB_001c0b8b;
    }
    uVar28 = *(ulong *)((long)src + 0x18);
    *(ulong *)(pBVar35 + 0x10) = *(ulong *)((long)src + 0x10);
    *(ulong *)(pBVar35 + 0x18) = uVar28;
    if (0x20 < (long)uVar30) {
      lVar38 = 0;
      do {
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x20);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        pBVar5 = pBVar35 + lVar38 + 0x20;
        *(undefined8 *)pBVar5 = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 8) = uVar18;
        pBVar7 = (BYTE *)((long)src + lVar38 + 0x30);
        uVar18 = *(undefined8 *)(pBVar7 + 8);
        *(undefined8 *)(pBVar5 + 0x10) = *(undefined8 *)pBVar7;
        *(undefined8 *)(pBVar5 + 0x18) = uVar18;
        lVar38 = lVar38 + 0x20;
      } while (pBVar5 + 0x20 < pBVar35 + uVar30);
    }
  }
  seqStore->lit = seqStore->lit + uVar30;
  psVar54 = seqStore->sequences;
  if (0xffff < uVar30) {
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001c0b8b:
  uVar28 = lVar36 - 3;
  psVar54->litLength = (U16)uVar30;
  psVar54->offset = UVar46 + 3;
  UVar48 = local_12c;
joined_r0x001c07d5:
  if (0xffff < uVar28) {
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
  }
  src = (void *)(lVar36 + (long)puVar34);
  psVar54->matchLength = (U16)uVar28;
  psVar54 = psVar54 + 1;
  seqStore->sequences = psVar54;
  puVar51 = (ulong *)src;
  local_12c = UVar46;
  if (src <= puVar6) {
    uVar41 = UVar50 + 2;
    lVar36 = *(long *)(pBVar9 + uVar41);
    pUVar12[(ulong)(lVar36 * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] = uVar41;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar25 & 0x3f)] =
         ((int)src + -2) - iVar45;
    pUVar13[(ulong)(lVar36 * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] = uVar41;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar26 & 0x3f)] =
         ((int)src + -1) - iVar45;
    UVar50 = UVar48;
    do {
      UVar20 = UVar46;
      UVar46 = (int)src - iVar45;
      uVar41 = UVar46 - UVar50;
      pBVar35 = pBVar9;
      if (uVar41 < uVar17) {
        pBVar35 = pBVar11 + -uVar43;
      }
      puVar51 = (ulong *)src;
      UVar48 = UVar50;
      local_12c = UVar20;
      if ((0xfffffffc < uVar41 - uVar17) || (*(int *)(pBVar35 + uVar41) != (int)*src)) break;
      puVar51 = iEnd;
      if (uVar41 < uVar17) {
        puVar51 = mEnd;
      }
      sVar22 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar35 + uVar41) + 4),
                          (BYTE *)iEnd,(BYTE *)puVar51,(BYTE *)iStart);
      if (src <= puVar21) {
        puVar51 = (ulong *)seqStore->lit;
        uVar30 = *(ulong *)((long)src + 8);
        *puVar51 = *src;
        puVar51[1] = uVar30;
        psVar54 = seqStore->sequences;
      }
      psVar54->litLength = 0;
      psVar54->offset = 1;
      if (0xffff < sVar22 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar54 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar54->matchLength = (U16)(sVar22 + 1);
      psVar54 = psVar54 + 1;
      seqStore->sequences = psVar54;
      uVar30 = *src;
      pUVar13[uVar30 * -0x30e44323405a9d00 >> (bVar26 & 0x3f)] = UVar46;
      pUVar12[uVar30 * -0x30e44323485a9b9d >> (bVar25 & 0x3f)] = UVar46;
      src = (void *)((long)src + sVar22 + 4);
      puVar51 = (ulong *)src;
      UVar48 = UVar20;
      local_12c = UVar50;
      UVar46 = UVar50;
      UVar50 = UVar20;
    } while (src <= puVar6);
  }
LAB_001c0d89:
  if (puVar6 <= puVar51) goto LAB_001c3360;
  goto LAB_001c01c4;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}